

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_info.c
# Opt level: O0

apx_error_t rmf_fileInfo_create_copy(rmf_fileInfo_t *self,rmf_fileInfo_t *other)

{
  adt_error_t error_code;
  adt_error_t result;
  rmf_fileInfo_t *other_local;
  rmf_fileInfo_t *self_local;
  
  if (self == (rmf_fileInfo_t *)0x0) {
    self_local._4_4_ = 1;
  }
  else {
    self->address = other->address;
    self->size = other->size;
    self->rmf_file_type = other->rmf_file_type;
    self->digest_type = other->digest_type;
    adt_str_create(&self->name);
    error_code = adt_str_set(&self->name,&other->name);
    if (error_code == '\0') {
      self_local._4_4_ = rmf_fileInfo_set_digest_data(self,other->digest_type,other->digest_data);
    }
    else {
      self_local._4_4_ = convert_from_adt_to_apx_error(error_code);
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t rmf_fileInfo_create_copy(rmf_fileInfo_t* self, rmf_fileInfo_t const* other)
{
   if (self != NULL)
   {
      adt_error_t result;
      self->address = other->address;
      self->size = other->size;
      self->rmf_file_type = other->rmf_file_type;
      self->digest_type = other->digest_type;
      adt_str_create(&self->name);
      result = adt_str_set(&self->name, &other->name);
      if (result != ADT_NO_ERROR)
      {
         return convert_from_adt_to_apx_error(result);
      }
      return rmf_fileInfo_set_digest_data(self, other->digest_type, &other->digest_data[0]);
   }
   return APX_INVALID_ARGUMENT_ERROR;
}